

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  char_t cVar1;
  xpath_ast_node *pxVar2;
  bool bVar3;
  byte *pbVar4;
  xpath_variable *pxVar5;
  char_t *pcVar6;
  byte bVar7;
  byte bVar8;
  char_t cVar9;
  xpath_ast_node *pxVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 local_98 [16];
  undefined8 uStack_88;
  xpath_variable *pxStack_80;
  undefined8 uStack_78;
  xpath_variable *pxStack_70;
  undefined8 uStack_68;
  xpath_variable *pxStack_60;
  undefined1 local_58 [64];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  bVar7 = this->_type;
  if ((bVar7 & 0xfe) == 0x10) {
    pxVar10 = this->_right;
    if (pxVar10 != (xpath_ast_node *)0x0) {
      if (((pxVar10->_type == '\x03') && (pxVar10->_left->_type == '\x16')) &&
         (pxVar2 = pxVar10->_right, pxVar2->_rettype == '\x02')) {
        this->_right = pxVar2;
        pxVar10 = pxVar2;
      }
      if (this->_test != '\0') {
        __assert_fail("_test == predicate_default",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2afa,
                      "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                     );
      }
      if (((pxVar10->_type != '\x13') || ((pxVar10->_data).number != 1.0)) ||
         (NAN((pxVar10->_data).number))) {
        if (pxVar10->_rettype == '\x02') {
          if ((byte)(pxVar10->_type - 0x13U) < 3) {
            this->_test = '\x02';
          }
        }
        else {
          bVar3 = is_posinv_expr(pxVar10);
          if (bVar3) {
            this->_test = '\x01';
          }
        }
      }
      else {
        this->_test = '\x03';
      }
    }
  }
  else {
    if (bVar7 != 0x38) goto LAB_00124315;
    if (((((((byte)this->_axis < 0xd) && ((0x1038U >> ((byte)this->_axis & 0x1f) & 1) != 0)) &&
          (pxVar10 = this->_left, pxVar10 != (xpath_ast_node *)0x0)) &&
         ((pxVar10->_type == '8' && (pxVar10->_axis == '\x05')))) && (pxVar10->_test == '\x02')) &&
       ((pxVar10->_right == (xpath_ast_node *)0x0 && (bVar3 = is_posinv_step(this), bVar3)))) {
      this->_axis = (byte)(this->_axis - 3U) < 2 ^ 5;
      this->_left = this->_left->_left;
    }
  }
  bVar7 = this->_type;
LAB_00124315:
  if (bVar7 == 0x2c) {
    pxVar10 = this->_right;
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar10->_type != '\x12') {
      return;
    }
    if (pxVar10->_next->_type != '\x12') {
      return;
    }
    pbVar4 = (pxVar10->_data).string;
    pcVar6 = (pxVar10->_next->_data).string;
    local_58 = ZEXT1664(ZEXT816(0));
    _local_98 = ZEXT1664(ZEXT816(0));
    bVar8 = *pbVar4;
    if (bVar8 != 0) {
      do {
        pbVar4 = pbVar4 + 1;
        bVar7 = 0x2c;
        if (((char)bVar8 < '\0') || (cVar1 = *pcVar6, (char)cVar1 < '\0')) goto LAB_0012442b;
        if (local_98[bVar8] == '\0') {
          cVar9 = cVar1;
          if (cVar1 == '\0') {
            cVar9 = 0x80;
          }
          local_98[bVar8] = cVar9;
        }
        bVar8 = *pbVar4;
        pcVar6 = pcVar6 + (cVar1 != '\0');
      } while (bVar8 != 0);
    }
    auVar11 = vmovdqu64_avx512f(_local_98);
    auVar12 = vmovdqa64_avx512f(_DAT_0017e740);
    auVar13 = vmovdqa64_avx512f(_DAT_0017e780);
    vptestnmb_avx512f(auVar11,auVar11);
    _local_98 = vmovdqu8_avx512bw(auVar12);
    auVar11 = vmovdqu64_avx512f(local_58);
    vptestnmb_avx512f(auVar11,auVar11);
    local_58 = vmovdqu8_avx512bw(auVar13);
    pxVar5 = (xpath_variable *)xpath_allocator::allocate(alloc,0x80);
    if (pxVar5 != (xpath_variable *)0x0) {
      auVar11 = vmovdqu64_avx512f(local_58);
      auVar11 = vmovdqu64_avx512f(auVar11);
      *(undefined1 (*) [64])(pxVar5 + 4) = auVar11;
      *(undefined8 *)pxVar5 = local_98._0_8_;
      pxVar5->_next = (xpath_variable *)local_98._8_8_;
      *(undefined8 *)(pxVar5 + 1) = uStack_88;
      pxVar5[1]._next = pxStack_80;
      *(undefined8 *)(pxVar5 + 2) = uStack_78;
      pxVar5[2]._next = pxStack_70;
      *(undefined8 *)(pxVar5 + 3) = uStack_68;
      pxVar5[3]._next = pxStack_60;
      this->_type = ':';
      (this->_data).variable = pxVar5;
      return;
    }
    bVar7 = this->_type;
  }
LAB_0012442b:
  if ((((((bVar7 == 3) && (pxVar10 = this->_left, pxVar10 != (xpath_ast_node *)0x0)) &&
        (pxVar2 = this->_right, pxVar2 != (xpath_ast_node *)0x0)) &&
       ((pxVar10->_type == '8' && (pxVar10->_axis == '\x02')))) &&
      ((pxVar10->_test == '\x01' &&
       ((pxVar10->_left == (xpath_ast_node *)0x0 && (pxVar10->_right == (xpath_ast_node *)0x0))))))
     && ((pxVar2->_type == '\x12' || ((pxVar2->_type == '\x14' && (pxVar2->_rettype == '\x03'))))))
  {
    this->_type = ';';
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}